

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O1

int Cudd_bddPrintCover(DdManager *dd,DdNode *l,DdNode *u)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  int *array;
  DdNode *pDVar4;
  DdNode *pDVar5;
  long lVar6;
  int length;
  int local_34;
  
  iVar3 = Cudd_ReadSize(dd);
  array = (int *)malloc((long)iVar3 << 2);
  if (array != (int *)0x0) {
    piVar1 = (int *)(((ulong)l & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    do {
      pDVar4 = Cudd_ReadLogicZero(dd);
      if (l == pDVar4) {
        fputc(10,(FILE *)dd->out);
        Cudd_RecursiveDeref(dd,l);
        if (array == (int *)0x0) {
          return 1;
        }
        free(array);
        return 1;
      }
      pDVar5 = Cudd_LargestCube(dd,l,&local_34);
      pDVar4 = l;
      if (pDVar5 == (DdNode *)0x0) {
LAB_007f6e36:
        Cudd_RecursiveDeref(dd,pDVar4);
        pDVar5 = l;
        if (array != (int *)0x0) {
          free(array);
        }
LAB_007f6e4d:
        bVar2 = false;
        array = (int *)0x0;
        l = pDVar5;
      }
      else {
        piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        pDVar4 = Cudd_bddMakePrime(dd,pDVar5,u);
        if (pDVar4 == (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,l);
          pDVar4 = pDVar5;
          goto LAB_007f6e36;
        }
        piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(dd,pDVar5);
        pDVar5 = Cudd_bddAnd(dd,l,(DdNode *)((ulong)pDVar4 ^ 1));
        if (pDVar5 == (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,l);
          goto LAB_007f6e36;
        }
        piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(dd,l);
        iVar3 = Cudd_BddToCubeArray(dd,pDVar4,array);
        if (iVar3 == 0) {
          Cudd_RecursiveDeref(dd,pDVar5);
          Cudd_RecursiveDeref(dd,pDVar4);
          if (array != (int *)0x0) {
            free(array);
          }
          goto LAB_007f6e4d;
        }
        if (0 < dd->size) {
          lVar6 = 0;
          do {
            iVar3 = array[lVar6];
            if (iVar3 == 0) {
              iVar3 = 0x30;
            }
            else if (iVar3 == 2) {
              iVar3 = 0x2d;
            }
            else if (iVar3 == 1) {
              iVar3 = 0x31;
            }
            else {
              iVar3 = 0x3f;
            }
            fputc(iVar3,(FILE *)dd->out);
            lVar6 = lVar6 + 1;
          } while (lVar6 < dd->size);
        }
        fwrite(" 1\n",3,1,(FILE *)dd->out);
        Cudd_RecursiveDeref(dd,pDVar4);
        bVar2 = true;
        l = pDVar5;
      }
    } while (bVar2);
  }
  return 0;
}

Assistant:

int
Cudd_bddPrintCover(
  DdManager *dd,
  DdNode *l,
  DdNode *u)
{
    int *array;
    int q, result;
    DdNode *lb;
#ifdef DD_DEBUG
    DdNode *cover;
#endif

    array = ABC_ALLOC(int, Cudd_ReadSize(dd));
    if (array == NULL) return(0);
    lb = l;
    cuddRef(lb);
#ifdef DD_DEBUG
    cover = Cudd_ReadLogicZero(dd);
    cuddRef(cover);
#endif
    while (lb != Cudd_ReadLogicZero(dd)) {
        DdNode *implicant, *prime, *tmp;
        int length;
        implicant = Cudd_LargestCube(dd,lb,&length);
        if (implicant == NULL) {
            Cudd_RecursiveDeref(dd,lb);
            ABC_FREE(array);
            return(0);
        }
        cuddRef(implicant);
        prime = Cudd_bddMakePrime(dd,implicant,u);
        if (prime == NULL) {
            Cudd_RecursiveDeref(dd,lb);
            Cudd_RecursiveDeref(dd,implicant);
            ABC_FREE(array);
            return(0);
        }
        cuddRef(prime);
        Cudd_RecursiveDeref(dd,implicant);
        tmp = Cudd_bddAnd(dd,lb,Cudd_Not(prime));
        if (tmp == NULL) {
            Cudd_RecursiveDeref(dd,lb);
            Cudd_RecursiveDeref(dd,prime);
            ABC_FREE(array);
            return(0);
        }
        cuddRef(tmp);
        Cudd_RecursiveDeref(dd,lb);
        lb = tmp;
        result = Cudd_BddToCubeArray(dd,prime,array);
        if (result == 0) {
            Cudd_RecursiveDeref(dd,lb);
            Cudd_RecursiveDeref(dd,prime);
            ABC_FREE(array);
            return(0);
        }
        for (q = 0; q < dd->size; q++) {
            switch (array[q]) {
            case 0:
                (void) fprintf(dd->out, "0");
                break;
            case 1:
                (void) fprintf(dd->out, "1");
                break;
            case 2:
                (void) fprintf(dd->out, "-");
                break;
            default:
                (void) fprintf(dd->out, "?");
            }
        }
        (void) fprintf(dd->out, " 1\n");
#ifdef DD_DEBUG
        tmp = Cudd_bddOr(dd,prime,cover);
        if (tmp == NULL) {
            Cudd_RecursiveDeref(dd,cover);
            Cudd_RecursiveDeref(dd,lb);
            Cudd_RecursiveDeref(dd,prime);
            ABC_FREE(array);
            return(0);
        }
        cuddRef(tmp);
        Cudd_RecursiveDeref(dd,cover);
        cover = tmp;
#endif
        Cudd_RecursiveDeref(dd,prime);
    }
    (void) fprintf(dd->out, "\n");
    Cudd_RecursiveDeref(dd,lb);
    ABC_FREE(array);
#ifdef DD_DEBUG
    if (!Cudd_bddLeq(dd,cover,u) || !Cudd_bddLeq(dd,l,cover)) {
        Cudd_RecursiveDeref(dd,cover);
        return(0);
    }
    Cudd_RecursiveDeref(dd,cover);
#endif
    return(1);

}